

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.h
# Opt level: O2

void SEND(HttpResponse *res)

{
  int __fd;
  int iVar1;
  char *__file;
  int __fd_00;
  size_t sVar2;
  ssize_t sVar3;
  ostream *poVar4;
  string *in_RCX;
  int iVar5;
  string headerStr;
  char buffer [4096];
  string local_1058;
  undefined1 local_1038 [4104];
  
  HttpResponse::getHeaderStr_abi_cxx11_(&local_1058,res);
  __fd = res->_fd;
  __file = res->filename;
  if (res->isChunked == true) {
    write_chunked(__fd,__file,(int)&local_1058,in_RCX);
  }
  else {
    iVar5 = res->start_pos;
    iVar1 = res->end_pos;
    __fd_00 = open(__file,0,0);
    sVar2 = get_file_size(__file);
    if (__fd_00 < 2) {
      printf("open %s error\n");
    }
    memset(local_1038,0,0x1000);
    sVar3 = write(__fd,local_1058._M_dataplus._M_p,local_1058._M_string_length);
    poVar4 = std::operator<<((ostream *)&std::cout,"wcnt:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,(int)sVar3);
    std::endl<char,std::char_traits<char>>(poVar4);
    if (iVar5 != 0) {
      lseek(__fd_00,(long)iVar5 << 0xc,0);
    }
    if (iVar1 < 1) {
      do {
        sVar3 = read(__fd_00,local_1038,0x1000);
        write(__fd,local_1038,(long)(int)sVar3);
        if ((int)sVar3 != 0x1000) break;
        iVar5 = (int)sVar2;
        sVar2 = (size_t)(iVar5 - 0x1000);
      } while (0x1000 < iVar5);
    }
    else {
      iVar5 = (iVar1 - iVar5) + 0x1000;
      do {
        sVar3 = read(__fd_00,local_1038,0x1000);
        write(__fd,local_1038,(long)(int)sVar3);
        iVar5 = iVar5 + -0x1000;
      } while (0x1000 < iVar5);
    }
    close(__fd_00);
  }
  std::__cxx11::string::~string((string *)&local_1058);
  return;
}

Assistant:

void SEND(HttpResponse &res)
    {
        string headerStr = res.getHeaderStr();
        if (res.IsChunked())
        {
            write_chunked(res._fd, res.filename, 1024, headerStr);
        }
        else
        {
            write_static(res._fd, res.filename, res.start_pos, res.end_pos, headerStr);
        }
    }